

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

bool __thiscall
flatbuffers::cpp::CppGenerator::NeedsCopyCtorAssignOp(CppGenerator *this,StructDef *struct_def)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  FieldDef *pFVar4;
  int iVar5;
  const_iterator cVar6;
  pointer ppFVar7;
  byte bVar8;
  pointer ppFVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  key_type local_58;
  pointer local_38;
  
  ppFVar9 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar7 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar11 = ppFVar9 != ppFVar7;
  local_38 = ppFVar7;
  if (bVar11) {
    do {
      pFVar3 = *ppFVar9;
      bVar13 = 3;
      bVar8 = 3;
      if (pFVar3->deprecated == false) {
        BVar2 = (pFVar3->value).type.base_type;
        if ((BVar2 == BASE_TYPE_VECTOR) || (BVar2 == BASE_TYPE_VECTOR64)) {
          if ((pFVar3->value).type.element != BASE_TYPE_UTYPE) {
            paVar1 = &local_58.field_2;
            local_58._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cpp_type","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                            *)&(pFVar3->super_Definition).attributes,&local_58);
            if ((_Rb_tree_header *)cVar6._M_node ==
                &(pFVar3->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
              bVar12 = true;
            }
            else {
              bVar12 = *(long *)(cVar6._M_node + 2) == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar1) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            pFVar3 = *ppFVar9;
            local_58._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cpp_ptr_type","");
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                            *)&(pFVar3->super_Definition).attributes,&local_58);
            ppFVar7 = local_38;
            if ((_Rb_tree_header *)cVar6._M_node ==
                &(pFVar3->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
              lVar10 = 0;
            }
            else {
              lVar10 = *(long *)(cVar6._M_node + 2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar1) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            pFVar3 = *ppFVar9;
            if (((((pFVar3->value).type.base_type - BASE_TYPE_VECTOR & 0xfffffffb) == 0) &&
                ((pFVar3->value).type.element == BASE_TYPE_STRUCT)) &&
               (((pFVar3->value).type.struct_def)->fixed == false)) {
              bVar13 = pFVar3->native_inline ^ 1;
              if (!bVar12 && (bVar13 & 1) == 0) {
LAB_00198ac1:
                iVar5 = std::__cxx11::string::compare((char *)(lVar10 + 0x20));
                bVar13 = iVar5 != 0;
              }
            }
            else {
              bVar13 = 0;
              if (!bVar12) goto LAB_00198ac1;
            }
          }
          bVar8 = bVar13;
          if (bVar13 != 0) goto LAB_00198b4c;
        }
        else if (BVar2 == BASE_TYPE_STRUCT) {
          paVar1 = &local_58.field_2;
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cpp_type","");
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)&(pFVar3->super_Definition).attributes,&local_58);
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(pFVar3->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
            bVar12 = true;
          }
          else {
            bVar12 = *(long *)(cVar6._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          pFVar4 = *ppFVar9;
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cpp_ptr_type","");
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)&(pFVar4->super_Definition).attributes,&local_58);
          ppFVar7 = local_38;
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(pFVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
            lVar10 = 0;
          }
          else {
            lVar10 = *(long *)(cVar6._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          bVar8 = 1;
          if ((((pFVar3->value).type.base_type != BASE_TYPE_STRUCT) ||
              (((pFVar3->value).type.struct_def)->fixed != true)) ||
             (((*ppFVar9)->native_inline != true ||
              ((!bVar12 &&
               (iVar5 = std::__cxx11::string::compare((char *)(lVar10 + 0x20)), iVar5 != 0))))))
          goto LAB_00198b4c;
        }
        bVar8 = 0;
      }
LAB_00198b4c:
      if ((bVar8 != 3) && (bVar8 != 0)) {
        return bVar11;
      }
      ppFVar9 = ppFVar9 + 1;
      bVar11 = ppFVar9 != ppFVar7;
    } while (bVar11);
  }
  return bVar11;
}

Assistant:

std::string GenEnumValDecl(const EnumDef &enum_def,
                             const std::string &enum_val) const {
    return opts_.prefixed_enums ? Name(enum_def) + "_" + enum_val : enum_val;
  }